

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldExpandGroup
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  size_t sVar5;
  ChangeInfo *pCVar6;
  uint uVar7;
  char *pcVar8;
  StringPtr *params_1;
  undefined7 in_register_00000011;
  Reader value;
  Reader value_00;
  Builder newDecl;
  StructBuilder local_168;
  undefined4 local_13c;
  undefined2 *local_138;
  undefined1 local_130 [40];
  StructBuilder local_108;
  PointerBuilder local_e0;
  String local_c8;
  SegmentBuilder *local_a8;
  SegmentBuilder *pSStack_a0;
  SegmentBuilder *local_90;
  uint *local_88;
  ChangeInfo *local_80;
  ChangeInfo local_78;
  ArrayPtr<const_char> local_58;
  Builder local_48;
  
  local_13c = (undefined4)CONCAT71(in_register_00000011,scopeHasUnion);
  local_168.data = decl._builder.pointers + 2;
  local_168.segment = decl._builder.segment;
  local_168.capTable = decl._builder.capTable;
  local_88 = nextOrdinal;
  local_80 = __return_storage_ptr__;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)local_130,(PointerBuilder *)&local_168,1,(StructSize)0x80002);
  capnp::_::ListBuilder::getStructElement(&local_108,(ListBuilder *)local_130,0);
  local_e0.segment = decl._builder.segment;
  local_e0.capTable = decl._builder.capTable;
  local_e0.pointer = decl._builder.pointers;
  capnp::_::PointerBuilder::disown((OrphanBuilder *)local_130,&local_e0);
  local_168.data = (void *)local_130._16_8_;
  local_168.pointers = (WirePointer *)local_130._24_8_;
  local_168.segment = (SegmentBuilder *)local_130._0_8_;
  local_168.capTable = (CapTableBuilder *)local_130._8_8_;
  local_130._0_8_ = local_108.segment;
  local_130._8_8_ = local_108.capTable;
  local_130._16_8_ = local_108.pointers;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)local_130,(OrphanBuilder *)&local_168);
  if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
  }
  pWVar4 = local_108.pointers;
  pvVar3 = local_108.data;
  local_a8 = local_108.segment;
  pSStack_a0 = (SegmentBuilder *)local_108.capTable;
  local_e0.pointer = decl._builder.pointers + 1;
  local_e0.segment = decl._builder.segment;
  local_e0.capTable = decl._builder.capTable;
  capnp::_::PointerBuilder::disown((OrphanBuilder *)local_130,&local_e0);
  local_168.data = (void *)local_130._16_8_;
  local_168.pointers = (WirePointer *)local_130._24_8_;
  local_168.segment = (SegmentBuilder *)local_130._0_8_;
  local_168.capTable = (CapTableBuilder *)local_130._8_8_;
  *(undefined2 *)pvVar3 = 2;
  local_130._16_8_ = pWVar4 + 1;
  local_130._0_8_ = local_a8;
  local_130._8_8_ = pSStack_a0;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)local_130,(OrphanBuilder *)&local_168);
  if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
  }
  local_a8 = (SegmentBuilder *)decl._builder.data;
  *(undefined2 *)((long)local_108.data + 2) = 6;
  *(undefined2 *)((long)local_108.data + 0xc) = 0;
  local_130._16_8_ = local_108.pointers + 5;
  local_130._0_8_ = local_108.segment;
  local_130._8_8_ = local_108.capTable;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_130);
  local_130._16_8_ = local_108.pointers + 6;
  local_130._0_8_ = local_108.segment;
  local_130._8_8_ = local_108.capTable;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_130);
  pWVar4 = local_108.pointers;
  pCVar2 = local_108.capTable;
  pSVar1 = local_108.segment;
  local_138 = (undefined2 *)local_108.data;
  local_e0.pointer = decl._builder.pointers + 5;
  local_90 = decl._builder.segment;
  local_e0.segment = decl._builder.segment;
  local_e0.capTable = decl._builder.capTable;
  capnp::_::PointerBuilder::disown((OrphanBuilder *)local_130,&local_e0);
  local_168.data = (void *)local_130._16_8_;
  local_168.pointers = (WirePointer *)local_130._24_8_;
  local_168.segment = (SegmentBuilder *)local_130._0_8_;
  local_168.capTable = (CapTableBuilder *)local_130._8_8_;
  local_130._16_8_ = pWVar4 + 5;
  local_130._0_8_ = pSVar1;
  local_130._8_8_ = pCVar2;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)local_130,(OrphanBuilder *)&local_168);
  if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
  }
  if (*(short *)((long)local_a8 + 0xc) == 1) {
    local_e0.pointer = decl._builder.pointers + 6;
    local_e0.segment = local_90;
    local_e0.capTable = decl._builder.capTable;
    capnp::_::PointerBuilder::disown((OrphanBuilder *)local_130,&local_e0);
    local_168.data = (void *)local_130._16_8_;
    local_168.pointers = (WirePointer *)local_130._24_8_;
    local_168.segment = (SegmentBuilder *)local_130._0_8_;
    local_168.capTable = (CapTableBuilder *)local_130._8_8_;
    local_138[6] = 1;
    local_130._16_8_ = pWVar4 + 6;
    local_130._0_8_ = pSVar1;
    local_130._8_8_ = pCVar2;
    capnp::_::PointerBuilder::adopt((PointerBuilder *)local_130,(OrphanBuilder *)&local_168);
    if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
    }
  }
  else {
    local_138[6] = 0;
  }
  local_168.segment = decl._builder.segment;
  local_168.capTable = decl._builder.capTable;
  local_168.data = decl._builder.pointers;
  capnp::_::PointerBuilder::initStruct
            ((StructBuilder *)local_130,(PointerBuilder *)&local_168,(StructSize)0x10001);
  local_e0.segment = local_108.segment;
  local_e0.capTable = local_108.capTable;
  local_e0.pointer = local_108.pointers;
  capnp::_::PointerBuilder::getStruct(&local_168,&local_e0,(StructSize)0x10001,(word *)0x0);
  local_e0.segment = local_168.segment;
  local_e0.capTable = local_168.capTable;
  local_e0.pointer = local_168.pointers;
  params_1 = (StringPtr *)0x0;
  capnp::_::PointerBuilder::getBlob<capnp::Text>(&local_48,&local_e0,(void *)0x0,0);
  local_e0.segment = (SegmentBuilder *)0x1e158f;
  local_e0.capTable = (CapTableBuilder *)0x1;
  local_58.ptr = local_48.content.ptr;
  local_58.size_ = local_48.content.size_;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::StringPtr>(&local_c8,(_ *)&local_e0,&local_58,params_1)
  ;
  pcVar8 = local_c8.content.ptr;
  if (local_c8.content.size_ == 0) {
    pcVar8 = "";
  }
  value.super_StringPtr.content.size_ = local_c8.content.size_ + (local_c8.content.size_ == 0);
  local_e0.segment = (SegmentBuilder *)local_130._0_8_;
  local_e0.capTable = (CapTableBuilder *)local_130._8_8_;
  local_e0.pointer = (WirePointer *)local_130._24_8_;
  value.super_StringPtr.content.ptr = pcVar8;
  capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_e0,value);
  sVar5 = local_c8.content.size_;
  pcVar8 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_c8.content.disposer)
              (local_c8.content.disposer,pcVar8,1,sVar5,sVar5,0);
  }
  *(undefined2 *)decl._builder.data = 0;
  uVar7 = rand();
  if ((uVar7 & 1) == 0) {
    *(undefined2 *)((long)decl._builder.data + 2) = 8;
  }
  else {
    *(undefined2 *)((long)decl._builder.data + 2) = 7;
    if (((char)local_13c == '\0') && (uVar7 = rand(), (uVar7 & 1) == 0)) {
      local_168.segment = decl._builder.segment;
      local_168.capTable = decl._builder.capTable;
      local_168.data = decl._builder.pointers;
      capnp::_::PointerBuilder::getStruct
                ((StructBuilder *)local_130,(PointerBuilder *)&local_168,(StructSize)0x10001,
                 (word *)0x0);
      local_168.segment = (SegmentBuilder *)local_130._0_8_;
      local_168.capTable = (CapTableBuilder *)local_130._8_8_;
      local_168.data = (void *)local_130._24_8_;
      value_00.super_StringPtr.content.size_ = 1;
      value_00.super_StringPtr.content.ptr = "";
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_168,value_00);
    }
    structAddField(&local_78,decl,local_88,false);
    sVar5 = local_78.description.content.size_;
    pcVar8 = local_78.description.content.ptr;
    if (local_78.description.content.ptr != (char *)0x0) {
      local_78.description.content.ptr = (char *)0x0;
      local_78.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_78.description.content.disposer)
                (local_78.description.content.disposer,pcVar8,1,sVar5,sVar5,0);
    }
  }
  pCVar6 = local_80;
  local_80->kind = COMPATIBLE;
  kj::heapString(&local_80->description,0x22);
  pcVar8 = (char *)(pCVar6->description).content.size_;
  if (pcVar8 != (char *)0x0) {
    pcVar8 = (pCVar6->description).content.ptr;
  }
  builtin_strncpy(pcVar8,"Wrap a field in a singleton group.",0x22);
  return pCVar6;
}

Assistant:

static ChangeInfo fieldExpandGroup(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  Declaration::Builder newDecl = decl.initNestedDecls(1)[0];
  newDecl.adoptName(decl.disownName());
  newDecl.getId().adoptOrdinal(decl.getId().disownOrdinal());

  auto field = decl.getField();
  auto newField = newDecl.initField();

  newField.adoptType(field.disownType());
  if (field.getDefaultValue().isValue()) {
    newField.getDefaultValue().adoptValue(field.getDefaultValue().disownValue());
  } else {
    newField.getDefaultValue().setNone();
  }

  decl.initName().setValue(kj::str("g", newDecl.getName().getValue()));
  decl.getId().setUnspecified();

  if (rand() % 2 == 0) {
    decl.setGroup();
  } else {
    decl.setUnion();
    if (!scopeHasUnion && rand() % 2 == 0) {
      // Make it an unnamed union.
      decl.getName().setValue("");
    }
    structAddField(decl, nextOrdinal, scopeHasUnion);  // union must have two members
  }

  return { COMPATIBLE, "Wrap a field in a singleton group." };
}